

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::UninterpretedOption::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  UninterpretedOption *pUVar2;
  MessageLite *value;
  string *psVar3;
  UninterpretedOption **v1;
  UninterpretedOption **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *other;
  uint32_t *puVar5;
  Arena *pAVar6;
  uint32_t cached_has_bits;
  LogMessage local_98;
  Voidify local_81;
  UninterpretedOption *local_80;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  UninterpretedOption *from;
  UninterpretedOption *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  UninterpretedOption *local_48;
  anon_union_80_1_493b367e_for_UninterpretedOption_3 *local_40;
  string *local_38;
  UninterpretedOption *local_30;
  anon_union_80_1_493b367e_for_UninterpretedOption_3 *local_28;
  string *local_20;
  UninterpretedOption *local_18;
  anon_union_80_1_493b367e_for_UninterpretedOption_3 *local_10;
  
  local_80 = (UninterpretedOption *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (UninterpretedOption *)to_msg;
  _this = (UninterpretedOption *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::UninterpretedOption_const*>(&local_80);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::UninterpretedOption*>(&from);
  local_78 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::UninterpretedOption_const*,google::protobuf::UninterpretedOption*>
                       (v1,v2,"&from != _this");
  if (local_78 == (Nullable<const_char_*>)0x0) {
    this = _internal_mutable_name(from);
    other = _internal_name((UninterpretedOption *)absl_log_internal_check_op_result);
    RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::MergeFrom(this,other);
    puVar5 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    pUVar2 = from;
    uVar1 = *puVar5;
    if ((uVar1 & 0x3f) != 0) {
      if ((uVar1 & 1) != 0) {
        to_msg_local = (MessageLite *)
                       _internal_identifier_value_abi_cxx11_
                                 ((UninterpretedOption *)absl_log_internal_check_op_result);
        local_48 = pUVar2;
        local_40 = &pUVar2->field_0;
        puVar5 = internal::HasBits<1>::operator[](&(pUVar2->field_0)._impl_._has_bits_,0);
        value = to_msg_local;
        *puVar5 = *puVar5 | 1;
        pAVar6 = MessageLite::GetArena((MessageLite *)pUVar2);
        internal::ArenaStringPtr::Set<>
                  (&(pUVar2->field_0)._impl_.identifier_value_,(string *)value,pAVar6);
      }
      pUVar2 = from;
      if ((uVar1 & 2) != 0) {
        local_38 = _internal_string_value_abi_cxx11_
                             ((UninterpretedOption *)absl_log_internal_check_op_result);
        local_30 = pUVar2;
        local_28 = &pUVar2->field_0;
        puVar5 = internal::HasBits<1>::operator[](&(pUVar2->field_0)._impl_._has_bits_,0);
        psVar3 = local_38;
        *puVar5 = *puVar5 | 2;
        pAVar6 = MessageLite::GetArena((MessageLite *)pUVar2);
        internal::ArenaStringPtr::Set<>(&(pUVar2->field_0)._impl_.string_value_,psVar3,pAVar6);
      }
      pUVar2 = from;
      if ((uVar1 & 4) != 0) {
        local_20 = _internal_aggregate_value_abi_cxx11_
                             ((UninterpretedOption *)absl_log_internal_check_op_result);
        local_18 = pUVar2;
        local_10 = &pUVar2->field_0;
        puVar5 = internal::HasBits<1>::operator[](&(pUVar2->field_0)._impl_._has_bits_,0);
        psVar3 = local_20;
        *puVar5 = *puVar5 | 4;
        pAVar6 = MessageLite::GetArena((MessageLite *)pUVar2);
        internal::ArenaStringPtr::Set<>(&(pUVar2->field_0)._impl_.aggregate_value_,psVar3,pAVar6);
      }
      if ((uVar1 & 8) != 0) {
        (from->field_0)._impl_.positive_int_value_ =
             *(uint64_t *)(absl_log_internal_check_op_result + 0x48);
      }
      if ((uVar1 & 0x10) != 0) {
        (from->field_0)._impl_.negative_int_value_ =
             *(int64_t *)(absl_log_internal_check_op_result + 0x50);
      }
      if ((uVar1 & 0x20) != 0) {
        (from->field_0)._impl_.double_value_ = *(double *)(absl_log_internal_check_op_result + 0x58)
        ;
      }
    }
    puVar5 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar5 = uVar1 | *puVar5;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_78);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x3337,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_98);
}

Assistant:

void UninterpretedOption::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<UninterpretedOption*>(&to_msg);
  auto& from = static_cast<const UninterpretedOption&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.UninterpretedOption)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_name()->MergeFrom(
      from._internal_name());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_identifier_value(from._internal_identifier_value());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_string_value(from._internal_string_value());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_aggregate_value(from._internal_aggregate_value());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.positive_int_value_ = from._impl_.positive_int_value_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.negative_int_value_ = from._impl_.negative_int_value_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.double_value_ = from._impl_.double_value_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}